

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

LogicalType *
duckdb::LogicalType::UNION(LogicalType *__return_storage_ptr__,child_list_t<LogicalType> *members)

{
  const_iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined1 local_69;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_68;
  value_type local_58;
  
  __position._M_current =
       (members->
       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[1],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&local_58,(char (*) [1])(anon_var_dwarf_4ed193b + 9),&UTINYINT);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::_M_insert_rval((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)members,__position,&local_58);
  ~LogicalType(&local_58.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p);
  }
  local_58.first._M_dataplus._M_p = (pointer)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::StructTypeInfo,std::allocator<duckdb::StructTypeInfo>,duckdb::vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,true>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.first._M_string_length,
             (StructTypeInfo **)&local_58,(allocator<duckdb::StructTypeInfo> *)&local_69,members);
  local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58.first._M_dataplus._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.first._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_58.first._M_string_length + 8) =
           *(_Atomic_word *)(local_58.first._M_string_length + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.first._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_013fb920;
    }
    else {
      *(_Atomic_word *)(local_58.first._M_string_length + 8) =
           *(_Atomic_word *)(local_58.first._M_string_length + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.first._M_string_length);
  }
LAB_013fb920:
  local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.first._M_string_length;
  LogicalType(__return_storage_ptr__,UNION,&local_68);
  if (local_68.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::UNION(child_list_t<LogicalType> members) {
	D_ASSERT(!members.empty());
	D_ASSERT(members.size() <= UnionType::MAX_UNION_MEMBERS);
	// union types always have a hidden "tag" field in front
	members.insert(members.begin(), {"", LogicalType::UTINYINT});
	auto info = make_shared_ptr<StructTypeInfo>(std::move(members));
	return LogicalType(LogicalTypeId::UNION, std::move(info));
}